

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

void __thiscall
vkt::BindingModel::anon_unknown_1::BufferRenderInstance::logTestPlan(BufferRenderInstance *this)

{
  ostringstream *this_00;
  ShaderInputInterface SVar1;
  ostream *poVar2;
  ostringstream *poVar3;
  ostringstream *this_01;
  char *pcVar4;
  char *pcVar5;
  ostringstream msg;
  string asStack_338 [32];
  ostringstream local_318 [376];
  MessageBuilder local_1a0;
  
  this_01 = local_318;
  std::__cxx11::ostringstream::ostringstream(this_01);
  poVar2 = std::operator<<((ostream *)this_01,"Rendering 2x2 yellow-green grid.\n");
  poVar2 = std::operator<<(poVar2,"Single descriptor set. Descriptor set contains ");
  SVar1 = this->m_shaderInterface;
  if (SVar1 == SHADER_INPUT_SINGLE_DESCRIPTOR) {
    pcVar4 = "single";
  }
  else if (SVar1 == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) {
    pcVar4 = "two";
  }
  else {
    pcVar4 = (char *)0x0;
    if (SVar1 == SHADER_INPUT_DESCRIPTOR_ARRAY) {
      pcVar4 = "an array (size 2) of";
    }
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2," descriptor(s) of type ");
  pcVar4 = ::vk::getDescriptorTypeName(this->m_descriptorType);
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Buffer view(s) have ");
  pcVar5 = "non-";
  pcVar4 = "";
  if (this->m_setViewOffset != false) {
    pcVar4 = "non-";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::operator<<(poVar2,"zero offset.\n");
  if ((this->m_descriptorType & ~VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER) ==
      VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER_DYNAMIC) {
    if (this->m_setDynamicOffset == true) {
      poVar2 = std::operator<<((ostream *)local_318,
                               "Source buffer(s) are given a dynamic offset at bind time.\n");
      poVar2 = std::operator<<(poVar2,"The supplied dynamic offset is ");
      if (this->m_dynamicOffsetNonZero == false) {
        pcVar5 = "";
      }
      poVar3 = (ostringstream *)std::operator<<(poVar2,pcVar5);
      pcVar4 = "zero.\n";
    }
    else {
      pcVar4 = "Dynamic offset is not supplied at bind time. Expecting bind to offset 0.\n";
      poVar3 = local_318;
    }
    std::operator<<((ostream *)poVar3,pcVar4);
  }
  if (this->m_stageFlags == 0) {
    pcVar4 = "Descriptors are not accessed in any shader stage.\n";
  }
  else {
    poVar2 = std::operator<<((ostream *)local_318,"Descriptors are accessed in {");
    pcVar4 = " vertex";
    if ((this->m_stageFlags & 1) == 0) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    pcVar4 = " tess_control";
    if ((this->m_stageFlags & 2) == 0) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    pcVar4 = " tess_evaluation";
    if ((this->m_stageFlags & 4) == 0) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    pcVar4 = " geometry";
    if ((this->m_stageFlags & 8) == 0) {
      pcVar4 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar4);
    pcVar4 = " fragment";
    if ((this->m_stageFlags & 0x10) == 0) {
      pcVar4 = "";
    }
    this_01 = (ostringstream *)std::operator<<(poVar2,pcVar4);
    pcVar4 = " } stages.\n";
  }
  std::operator<<((ostream *)this_01,pcVar4);
  local_1a0.m_log =
       ((this->super_SingleCmdRenderInstance).super_SingleTargetRenderInstance.super_TestInstance.
       m_context)->m_testCtx->m_log;
  this_00 = &local_1a0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::__cxx11::stringbuf::str();
  std::operator<<((ostream *)this_00,asStack_338);
  tcu::MessageBuilder::operator<<(&local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string(asStack_338);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::__cxx11::ostringstream::~ostringstream(local_318);
  return;
}

Assistant:

void BufferRenderInstance::logTestPlan (void) const
{
	std::ostringstream msg;

	msg << "Rendering 2x2 yellow-green grid.\n"
		<< "Single descriptor set. Descriptor set contains "
			<< ((m_shaderInterface == SHADER_INPUT_SINGLE_DESCRIPTOR) ? "single" :
			    (m_shaderInterface == SHADER_INPUT_MULTIPLE_CONTIGUOUS_DESCRIPTORS) ? "two" :
			    (m_shaderInterface == SHADER_INPUT_DESCRIPTOR_ARRAY) ? "an array (size 2) of" :
			    (const char*)DE_NULL)
		<< " descriptor(s) of type " << vk::getDescriptorTypeName(m_descriptorType) << "\n"
		<< "Buffer view(s) have " << ((m_setViewOffset) ? ("non-") : ("")) << "zero offset.\n";

	if (isDynamicDescriptorType(m_descriptorType))
	{
		if (m_setDynamicOffset)
		{
			msg << "Source buffer(s) are given a dynamic offset at bind time.\n"
				<< "The supplied dynamic offset is " << ((m_dynamicOffsetNonZero) ? ("non-") : ("")) << "zero.\n";
		}
		else
		{
			msg << "Dynamic offset is not supplied at bind time. Expecting bind to offset 0.\n";
		}
	}

	if (m_stageFlags == 0u)
	{
		msg << "Descriptors are not accessed in any shader stage.\n";
	}
	else
	{
		msg << "Descriptors are accessed in {"
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_VERTEX_BIT) != 0)					? (" vertex")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT) != 0)	? (" tess_control")		: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT) != 0)	? (" tess_evaluation")	: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_GEOMETRY_BIT) != 0)				? (" geometry")			: (""))
			<< (((m_stageFlags & vk::VK_SHADER_STAGE_FRAGMENT_BIT) != 0)				? (" fragment")			: (""))
			<< " } stages.\n";
	}

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< msg.str()
		<< tcu::TestLog::EndMessage;
}